

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

void Prs_CreateOutConcat(Cba_Ntk_t *p,int *pSlices,int nSlices)

{
  Vec_Int_t *p_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  Vec_Str_t *p_01;
  int Fill;
  uint uVar10;
  char *format;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  
  iVar6 = *pSlices;
  iVar1 = Cba_NtkGetMap(p,iVar6);
  uVar2 = Cba_NtkRangeLeft(p,-iVar1);
  uVar3 = Cba_NtkRangeRight(p,-iVar1);
  uVar10 = uVar3;
  if ((int)uVar2 < (int)uVar3) {
    uVar10 = uVar2;
  }
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  if (-1 < iVar1) {
    __assert_fail("RangeId > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x637,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
  }
  p_00 = &p->vArray1;
  Vec_IntFill(p_00,uVar3 + 1,Fill);
  uVar9 = 0;
  uVar11 = (ulong)(uint)nSlices;
  if (nSlices < 1) {
    uVar11 = uVar9;
  }
  while( true ) {
    if (uVar9 == uVar11) {
      iVar12 = 0;
      iVar1 = -1;
      for (uVar2 = uVar10; (int)uVar2 <= (int)uVar3; uVar2 = uVar2 + 1) {
        iVar5 = Vec_IntEntry(p_00,uVar2);
        iVar12 = iVar12 + (uint)(iVar1 != iVar5);
        iVar1 = iVar5;
      }
      iVar1 = Cba_ObjAlloc(p,CBA_BOX_CONCAT,iVar12,1);
      iVar5 = Cba_ObjFon0(p,iVar1);
      Cba_FonSetName(p,iVar5,iVar6);
      Prs_CreateRange(p,iVar5,iVar6);
      uVar2 = 0;
      uVar8 = 0;
      iVar6 = -1;
      while( true ) {
        format = (char *)(ulong)uVar10;
        uVar13 = ~uVar8;
        if ((int)uVar3 < (int)uVar10) break;
        iVar5 = Vec_IntEntry(p_00,uVar10);
        if (iVar6 == iVar5 || iVar6 == -1) {
          uVar2 = uVar2 + 1;
        }
        else {
          if (iVar6 == 0) {
            p_01 = Abc_NamBuffer(p->pDesign->pStrs);
            Vec_StrPrintF(p_01,format,(ulong)uVar2,"");
            iVar6 = Abc_NamStrFindOrAdd(p->pDesign->pFuns,p_01->pArray,(int *)0x0);
          }
          uVar7 = Cba_FonRangeSize(p,iVar6);
          if (uVar2 != uVar7) {
            __assert_fail("nBits == Cba_FonRangeSize(p, Prev)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                          ,0x661,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
          }
          uVar8 = uVar8 + 1;
          Cba_ObjSetFinFon(p,iVar1,uVar13 + iVar12,iVar6);
          uVar2 = 1;
        }
        uVar10 = uVar10 + 1;
        iVar6 = iVar5;
      }
      uVar10 = Cba_FonRangeSize(p,iVar6);
      if (uVar2 != uVar10) {
        __assert_fail("nBits == Cba_FonRangeSize(p, Prev)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x667,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
      }
      Cba_ObjSetFinFon(p,iVar1,uVar13 + iVar12,iVar6);
      if (uVar8 + 1 != iVar12) {
        __assert_fail("k == nParts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x669,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
      }
      return;
    }
    iVar1 = pSlices[uVar9 * 3 + 1];
    iVar12 = pSlices[uVar9 * 3 + 2];
    iVar4 = Cba_NtkRangeLeft(p,iVar1);
    iVar5 = Cba_NtkRangeRight(p,iVar1);
    iVar1 = iVar5;
    if (iVar5 < iVar4) {
      iVar1 = iVar4;
    }
    if ((iVar6 != pSlices[uVar9 * 3]) || (iVar12 < 1)) {
      __assert_fail("NameId == pSlices[3*i+0] && iFon > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x642,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
    }
    if (iVar4 < iVar5) {
      iVar5 = iVar4;
    }
    if ((iVar5 < (int)uVar10) || ((int)uVar3 < iVar1)) break;
    for (; iVar5 <= iVar1; iVar5 = iVar5 + 1) {
      iVar4 = Vec_IntEntry(p_00,iVar5);
      if (iVar4 != 0) {
        __assert_fail("Vec_IntEntry(vBits, k) == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                      ,0x646,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
      }
      Vec_IntWriteEntry(p_00,iVar5,iVar12);
    }
    uVar9 = uVar9 + 1;
  }
  __assert_fail("BotId <= Bot && Top <= TopId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                ,0x643,"void Prs_CreateOutConcat(Cba_Ntk_t *, int *, int)");
}

Assistant:

void Prs_CreateOutConcat( Cba_Ntk_t * p, int * pSlices, int nSlices )
{
    Vec_Int_t * vBits = &p->vArray1;
    int NameId    = pSlices[0];
    int RangeId   = -Cba_NtkGetMap(p, NameId);
    int LeftId    = Cba_NtkRangeLeft( p, RangeId );
    int RightId   = Cba_NtkRangeRight( p, RangeId );
    int BotId     = Abc_MinInt( LeftId, RightId );
    int TopId     = Abc_MaxInt( LeftId, RightId );
    int i, k, iObj, iFon, nParts, Prev, nBits;
    assert( RangeId > 0 );
    Vec_IntFill( vBits, Abc_MaxInt(LeftId, RightId) + 1, 0 );
    // fill up with slices
    for ( i = 0; i < nSlices; i++ )
    {
        int Range = pSlices[3*i+1];
        int iFon  = pSlices[3*i+2];
        int Left  = Cba_NtkRangeLeft( p, Range );
        int Right = Cba_NtkRangeRight( p, Range );
        int Bot   = Abc_MinInt( Left, Right );
        int Top   = Abc_MaxInt( Left, Right );
        assert( NameId == pSlices[3*i+0] && iFon > 0 );
        assert( BotId <= Bot && Top <= TopId );
        for ( k = Bot; k <= Top; k++ )
        {
            assert( Vec_IntEntry(vBits, k) == 0 );
            Vec_IntWriteEntry( vBits, k, iFon );
        }
    }
    // check how many parts we have
    Prev = -1; nParts = 0; 
    Vec_IntForEachEntryStartStop( vBits, iFon, i, BotId, TopId+1 )
    {
        if ( Prev != iFon )
            nParts++;
        Prev = iFon;
    }
    // create new concatenation
    iObj = Cba_ObjAlloc( p, CBA_BOX_CONCAT, nParts, 1 );
    iFon = Cba_ObjFon0(p, iObj);
    Cba_FonSetName( p, iFon, NameId );
    Prs_CreateRange( p, iFon, NameId );
    // set inputs
    k = 0; Prev = -1; nBits = 0;
    Vec_IntForEachEntryStartStop( vBits, iFon, i, BotId, TopId+1 )
    {
        if ( Prev == -1 || Prev == iFon )
            nBits++;
        else
        {
            if ( Prev == 0 ) // create constant
                Prev = Cba_ManNewConstZero( p, nBits );
            assert( nBits == Cba_FonRangeSize(p, Prev) );
            Cba_ObjSetFinFon( p, iObj, nParts-1-k++, Prev );
            nBits = 1;
        }
        Prev = iFon;         
    }
    assert( nBits == Cba_FonRangeSize(p, Prev) );
    Cba_ObjSetFinFon( p, iObj, nParts-1-k++, Prev );
    assert( k == nParts );
}